

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

string * __thiscall
leveldb::RandomString_abi_cxx11_(string *__return_storage_ptr__,leveldb *this,Random *rnd,int len)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  test::RandomString((Random *)this,(int)rnd,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static std::string RandomString(Random* rnd, int len) {
  std::string r;
  test::RandomString(rnd, len, &r);
  return r;
}